

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSemantic.cpp
# Opt level: O3

void __thiscall UnitTest_semantic4::Run(UnitTest_semantic4 *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  Terminator *pTVar3;
  Terminator *pTVar4;
  string local_80;
  _Head_base<0UL,_luna::SyntaxTree_*,_false> local_60;
  undefined1 *local_58;
  long local_50;
  undefined1 local_48 [16];
  size_type local_38;
  
  paVar1 = &local_80.field_2;
  local_80._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"t.m.n = a","");
  anon_unknown.dwarf_2f36d::Semantic((anon_unknown_dwarf_2f36d *)&local_60,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  local_80._M_dataplus._M_p = (pointer)&PTR__Visitor_001866f0;
  local_80._M_string_length = 0;
  (*(local_60._M_head_impl)->_vptr_SyntaxTree[2])(local_60._M_head_impl,&local_80,0);
  sVar2 = local_80._M_string_length;
  local_80._M_dataplus._M_p = (pointer)&PTR__Visitor_00186838;
  local_80._M_string_length = 0;
  (*(local_60._M_head_impl)->_vptr_SyntaxTree[2])(local_60._M_head_impl,&local_80,0);
  local_38 = local_80._M_string_length;
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"t","");
  local_80._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_80,local_58,local_58 + local_50);
  pTVar3 = ASTFind<luna::Terminator,FindName>
                     ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                      &local_60,(FindName *)&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  if (local_58 != local_48) {
    operator_delete(local_58);
  }
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"a","");
  local_80._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_80,local_58,local_58 + local_50);
  pTVar4 = ASTFind<luna::Terminator,FindName>
                     ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                      &local_60,(FindName *)&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  if (local_58 != local_48) {
    operator_delete(local_58);
  }
  if (*(int *)(sVar2 + 0x30) != 2) {
    local_80._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_80,"\'t_m_n->semantic_ == luna::SemanticOp_Write\'","");
    UnitTestBase::Error(&this->super_UnitTestBase,&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar1) {
      operator_delete(local_80._M_dataplus._M_p);
    }
  }
  if (*(int *)(local_38 + 0x30) != 1) {
    local_80._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_80,"\'t_m->semantic_ == luna::SemanticOp_Read\'","");
    UnitTestBase::Error(&this->super_UnitTestBase,&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar1) {
      operator_delete(local_80._M_dataplus._M_p);
    }
  }
  if (pTVar3->semantic_ != SemanticOp_Read) {
    local_80._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_80,"\'t->semantic_ == luna::SemanticOp_Read\'","");
    UnitTestBase::Error(&this->super_UnitTestBase,&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar1) {
      operator_delete(local_80._M_dataplus._M_p);
    }
  }
  if (pTVar4->semantic_ != SemanticOp_Read) {
    local_80._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_80,"\'a->semantic_ == luna::SemanticOp_Read\'","");
    UnitTestBase::Error(&this->super_UnitTestBase,&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar1) {
      operator_delete(local_80._M_dataplus._M_p);
    }
  }
  if (local_60._M_head_impl != (SyntaxTree *)0x0) {
    (*(local_60._M_head_impl)->_vptr_SyntaxTree[1])();
  }
  return;
}

Assistant:

TEST_CASE(semantic4)
{
    auto ast = Semantic("t.m.n = a");
    auto t_m_n = ASTFind<luna::MemberAccessor>(ast, [](luna::MemberAccessor *ma) {
        return ma->member_.str_->GetStdString() == "n";
    });
    auto t_m = ASTFind<luna::MemberAccessor>(ast, [](luna::MemberAccessor *ma) {
        return ma->member_.str_->GetStdString() == "m";
    });
    auto t = ASTFind<luna::Terminator>(ast, FindName("t"));
    auto a = ASTFind<luna::Terminator>(ast, FindName("a"));
    EXPECT_TRUE(t_m_n->semantic_ == luna::SemanticOp_Write);
    EXPECT_TRUE(t_m->semantic_ == luna::SemanticOp_Read);
    EXPECT_TRUE(t->semantic_ == luna::SemanticOp_Read);
    EXPECT_TRUE(a->semantic_ == luna::SemanticOp_Read);
}